

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O1

void ImGui::TableMergeDrawChannels(ImGuiTable *table)

{
  ImVec2 *pIVar1;
  undefined8 *puVar2;
  ImVector<unsigned_short> *pIVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  char cVar7;
  char cVar8;
  byte bVar9;
  ImDrawCmd *pIVar10;
  ImDrawChannel *pIVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  unsigned_short *puVar14;
  int iVar15;
  ImGuiContext *pIVar16;
  int iVar17;
  long lVar18;
  ImDrawChannel *pIVar19;
  int n;
  long lVar20;
  ulong uVar21;
  ulong uVar22;
  ImGuiTableColumn *pIVar23;
  uint uVar24;
  int iVar25;
  ulong uVar26;
  int iVar27;
  float *pfVar28;
  uint uVar29;
  ImDrawChannel *pIVar30;
  bool bVar31;
  uint uVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  ImBitArray<132> remaining_mask;
  MergeGroup merge_groups [4];
  ImBitArray<132> local_f8;
  float local_d8 [2];
  undefined8 local_d0;
  int iStack_c8;
  uint local_c4 [37];
  
  pIVar16 = GImGui;
  cVar7 = table->FreezeRowsCount;
  cVar8 = table->FreezeColumnsCount;
  lVar18 = 0;
  do {
    *(undefined8 *)((long)local_d8 + lVar18) = 0;
    *(undefined8 *)((long)&local_d0 + lVar18) = 0;
    lVar18 = lVar18 + 0x28;
  } while (lVar18 != 0xa0);
  uVar29 = 0;
  memset(local_d8,0,0xa0);
  iVar17 = table->ColumnsCount;
  if (0 < (long)iVar17) {
    uVar21 = table->VisibleMaskByIndex;
    uVar22 = 0;
    do {
      if ((uVar21 >> (uVar22 & 0x3f) & 1) != 0) {
        pIVar23 = (table->Columns).Data + uVar22;
        pIVar30 = (table->DrawSplitter)._Channels.Data;
        iVar25 = 0;
        do {
          bVar9 = *(byte *)((long)pIVar23 + (0x59 - (ulong)(iVar25 == 0)));
          pIVar19 = pIVar30 + bVar9;
          iVar27 = pIVar30[bVar9]._CmdBuffer.Size;
          if (0 < (long)iVar27) {
            if ((pIVar19->_CmdBuffer).Data[(long)iVar27 + -1].ElemCount == 0) {
              (pIVar19->_CmdBuffer).Size = iVar27 + -1;
            }
          }
          if ((pIVar19->_CmdBuffer).Size == 1) {
            if ((pIVar23->Flags & 0x80) == 0) {
              if (cVar7 < '\x01') {
                fVar33 = pIVar23->ContentMaxXUnfrozen;
LAB_00160649:
                uVar32 = -(uint)(pIVar23->ContentMaxXHeadersUsed <= fVar33);
                fVar33 = (float)(~uVar32 & (uint)pIVar23->ContentMaxXHeadersUsed |
                                (uint)fVar33 & uVar32);
              }
              else {
                if (iVar25 == 0) {
                  fVar33 = pIVar23->ContentMaxXFrozen;
                  goto LAB_00160649;
                }
                fVar33 = pIVar23->ContentMaxXUnfrozen;
              }
              pIVar1 = &(pIVar23->ClipRect).Max;
              if (pIVar1->x <= fVar33 && fVar33 != pIVar1->x) goto LAB_0016070f;
            }
            uVar32 = (uint)(iVar25 != 0) * 2;
            if (cVar7 < '\x01') {
              uVar32 = 2;
            }
            uVar24 = (uint)((long)cVar8 <= (long)uVar22 || cVar8 < '\x01');
            uVar26 = (ulong)(uVar32 | uVar24);
            pfVar28 = local_d8 + uVar26 * 10;
            iVar27 = local_c4[uVar26 * 10 + -1];
            if (iVar27 == 0) {
              pfVar28[0] = 3.4028235e+38;
              pfVar28[1] = 3.4028235e+38;
              (&local_d0)[uVar26 * 5] = 0xff7fffffff7fffff;
            }
            local_c4[uVar26 * 10 + (ulong)(bVar9 >> 5)] =
                 local_c4[uVar26 * 10 + (ulong)(bVar9 >> 5)] | 1 << (bVar9 & 0x1f);
            local_c4[uVar26 * 10 + -1] = iVar27 + 1;
            pIVar10 = (pIVar19->_CmdBuffer).Data;
            fVar33 = (pIVar10->ClipRect).x;
            if (fVar33 < *pfVar28) {
              *pfVar28 = fVar33;
            }
            fVar33 = (pIVar10->ClipRect).y;
            if (fVar33 < local_d8[uVar26 * 10 + 1]) {
              local_d8[uVar26 * 10 + 1] = fVar33;
            }
            fVar33 = (pIVar10->ClipRect).z;
            if (*(float *)(&local_d0 + uVar26 * 5) <= fVar33 &&
                fVar33 != *(float *)(&local_d0 + uVar26 * 5)) {
              *(float *)(&local_d0 + uVar26 * 5) = fVar33;
            }
            fVar33 = (pIVar10->ClipRect).w;
            pfVar28 = (float *)((long)&local_d0 + uVar26 * 0x28 + 4);
            if (*pfVar28 <= fVar33 && fVar33 != *pfVar28) {
              *(float *)((long)&local_d0 + uVar26 * 0x28 + 4) = fVar33;
            }
            uVar29 = uVar29 | 1 << (uVar32 | uVar24);
          }
LAB_0016070f:
          bVar31 = iVar25 == 0;
          iVar25 = iVar25 + -1;
        } while (('\0' < cVar7) && (bVar31));
        pIVar23->DrawChannelCurrent = 0xff;
      }
      uVar22 = uVar22 + 1;
    } while (uVar22 != (long)iVar17);
    if (uVar29 != 0) {
      iVar25 = (table->DrawSplitter)._Count + -2;
      iVar17 = (pIVar16->DrawChannelsTempMergeBuffer).Capacity;
      if (iVar17 < iVar25) {
        if (iVar17 == 0) {
          iVar27 = 8;
        }
        else {
          iVar27 = iVar17 / 2 + iVar17;
        }
        if (iVar27 <= iVar25) {
          iVar27 = iVar25;
        }
        if (iVar17 < iVar27) {
          pIVar19 = (ImDrawChannel *)MemAlloc((long)iVar27 << 5);
          pIVar30 = (pIVar16->DrawChannelsTempMergeBuffer).Data;
          if (pIVar30 != (ImDrawChannel *)0x0) {
            memcpy(pIVar19,pIVar30,(long)(pIVar16->DrawChannelsTempMergeBuffer).Size << 5);
            MemFree((pIVar16->DrawChannelsTempMergeBuffer).Data);
          }
          (pIVar16->DrawChannelsTempMergeBuffer).Data = pIVar19;
          (pIVar16->DrawChannelsTempMergeBuffer).Capacity = iVar27;
        }
      }
      (pIVar16->DrawChannelsTempMergeBuffer).Size = iVar25;
      pIVar30 = (pIVar16->DrawChannelsTempMergeBuffer).Data;
      local_f8.Storage[0] = 0;
      local_f8.Storage[1] = 0;
      local_f8.Storage[2] = 0;
      local_f8.Storage[3] = 0;
      local_f8.Storage[4] = 0;
      ImBitArray<132>::SetBitRange(&local_f8,2,(table->DrawSplitter)._Count);
      bVar9 = table->Bg2DrawChannelUnfrozen & 0x1f;
      local_f8.Storage[table->Bg2DrawChannelUnfrozen >> 5] =
           local_f8.Storage[table->Bg2DrawChannelUnfrozen >> 5] &
           (-2 << bVar9 | 0xfffffffeU >> 0x20 - bVar9);
      iVar17 = ((table->DrawSplitter)._Count - (uint)('\0' < cVar7)) + -2;
      fVar33 = (table->HostClipRect).Min.x;
      fVar4 = (table->HostClipRect).Min.y;
      fVar5 = (table->HostClipRect).Max.x;
      fVar6 = (table->HostClipRect).Max.y;
      lVar18 = (long)local_c4;
      uVar21 = 0;
      do {
        iVar25 = local_c4[uVar21 * 10 + -1];
        if (iVar25 != 0) {
          fVar35 = local_d8[uVar21 * 10];
          fVar34 = fVar35;
          if (fVar33 <= fVar35) {
            fVar34 = fVar33;
          }
          fVar36 = fVar34;
          if ('\0' < cVar8) {
            fVar36 = fVar35;
          }
          fVar35 = local_d8[uVar21 * 10 + 1];
          fVar37 = fVar35;
          if (fVar4 <= fVar35) {
            fVar37 = fVar4;
          }
          if (cVar7 < '\x01') {
            fVar35 = fVar37;
          }
          bVar31 = (uVar21 & 1) != 0;
          if (bVar31) {
            fVar34 = fVar36;
          }
          fVar36 = *(float *)(&local_d0 + uVar21 * 5);
          if (bVar31) {
            uVar29 = -(uint)(fVar5 <= fVar36);
            fVar36 = (float)(~uVar29 & (uint)fVar5 | uVar29 & (uint)fVar36);
          }
          if (uVar21 < 2) {
            fVar35 = fVar37;
          }
          fVar37 = *(float *)((long)&local_d0 + uVar21 * 0x28 + 4);
          if ((uVar21 >= 2) && ((table->Flags & 0x20000) == 0)) {
            uVar29 = -(uint)(fVar6 <= fVar37);
            fVar37 = (float)((uint)fVar37 & uVar29 | ~uVar29 & (uint)fVar6);
          }
          lVar20 = 0;
          do {
            local_f8.Storage[lVar20] = local_f8.Storage[lVar20] & ~*(uint *)(lVar18 + lVar20 * 4);
            lVar20 = lVar20 + 1;
          } while (lVar20 != 5);
          iVar17 = iVar17 - iVar25;
          if (0 < (table->DrawSplitter)._Count) {
            lVar20 = 8;
            uVar22 = 0;
            do {
              uVar26 = uVar22 >> 5 & 0x7ffffff;
              if ((local_c4[uVar21 * 10 + uVar26] >> ((uint)uVar22 & 0x1f) & 1) != 0) {
                local_c4[uVar21 * 10 + uVar26] =
                     local_c4[uVar21 * 10 + uVar26] & ~(1 << ((byte)uVar22 & 0x1f));
                iVar25 = iVar25 + -1;
                pIVar19 = (table->DrawSplitter)._Channels.Data;
                pfVar28 = *(float **)((long)&(pIVar19->_CmdBuffer).Size + lVar20);
                *pfVar28 = fVar34;
                pfVar28[1] = fVar35;
                pfVar28[2] = fVar36;
                pfVar28[3] = fVar37;
                puVar2 = (undefined8 *)((long)pIVar19 + lVar20 + -8);
                uVar12 = *puVar2;
                pIVar10 = (ImDrawCmd *)puVar2[1];
                puVar2 = (undefined8 *)((long)&(pIVar19->_CmdBuffer).Data + lVar20);
                uVar13 = *puVar2;
                puVar14 = (unsigned_short *)puVar2[1];
                (pIVar30->_IdxBuffer).Size = (int)uVar13;
                (pIVar30->_IdxBuffer).Capacity = (int)((ulong)uVar13 >> 0x20);
                (pIVar30->_IdxBuffer).Data = puVar14;
                (pIVar30->_CmdBuffer).Size = (int)uVar12;
                (pIVar30->_CmdBuffer).Capacity = (int)((ulong)uVar12 >> 0x20);
                (pIVar30->_CmdBuffer).Data = pIVar10;
                pIVar30 = pIVar30 + 1;
              }
              uVar22 = uVar22 + 1;
            } while (((long)uVar22 < (long)(table->DrawSplitter)._Count) &&
                    (lVar20 = lVar20 + 0x20, iVar25 != 0));
          }
        }
        if (uVar21 == 1 && '\0' < cVar7) {
          pIVar11 = (table->DrawSplitter)._Channels.Data;
          pIVar19 = pIVar11 + table->Bg2DrawChannelUnfrozen;
          iVar27 = (pIVar19->_CmdBuffer).Size;
          iVar15 = (pIVar19->_CmdBuffer).Capacity;
          pIVar10 = (pIVar19->_CmdBuffer).Data;
          pIVar3 = &pIVar11[table->Bg2DrawChannelUnfrozen]._IdxBuffer;
          iVar25 = pIVar3->Capacity;
          puVar14 = pIVar3->Data;
          (pIVar30->_IdxBuffer).Size = pIVar3->Size;
          (pIVar30->_IdxBuffer).Capacity = iVar25;
          (pIVar30->_IdxBuffer).Data = puVar14;
          (pIVar30->_CmdBuffer).Size = iVar27;
          (pIVar30->_CmdBuffer).Capacity = iVar15;
          (pIVar30->_CmdBuffer).Data = pIVar10;
          pIVar30 = pIVar30 + 1;
        }
        uVar21 = uVar21 + 1;
        lVar18 = lVar18 + 0x28;
      } while (uVar21 != 4);
      iVar25 = (table->DrawSplitter)._Count;
      if ((0 < iVar25) && (iVar17 != 0)) {
        lVar18 = 0;
        uVar21 = 0;
        do {
          if ((local_f8.Storage[uVar21 >> 5 & 0x7ffffff] >> ((uint)uVar21 & 0x1f) & 1) != 0) {
            pIVar19 = (table->DrawSplitter)._Channels.Data;
            puVar2 = (undefined8 *)((long)&(pIVar19->_CmdBuffer).Size + lVar18);
            uVar12 = *puVar2;
            pIVar10 = (ImDrawCmd *)puVar2[1];
            pIVar30->_IdxBuffer =
                 *(ImVector<unsigned_short> *)((long)&(pIVar19->_IdxBuffer).Size + lVar18);
            (pIVar30->_CmdBuffer).Size = (int)uVar12;
            (pIVar30->_CmdBuffer).Capacity = (int)((ulong)uVar12 >> 0x20);
            (pIVar30->_CmdBuffer).Data = pIVar10;
            pIVar30 = pIVar30 + 1;
            iVar17 = iVar17 + -1;
          }
          uVar21 = uVar21 + 1;
          iVar25 = (table->DrawSplitter)._Count;
        } while (((long)uVar21 < (long)iVar25) && (lVar18 = lVar18 + 0x20, iVar17 != 0));
      }
      memcpy((table->DrawSplitter)._Channels.Data + 2,(pIVar16->DrawChannelsTempMergeBuffer).Data,
             (long)iVar25 * 0x20 - 0x40);
    }
  }
  return;
}

Assistant:

void ImGui::TableMergeDrawChannels(ImGuiTable* table)
{
    ImGuiContext& g = *GImGui;
    ImDrawListSplitter* splitter = &table->DrawSplitter;
    const bool has_freeze_v = (table->FreezeRowsCount > 0);
    const bool has_freeze_h = (table->FreezeColumnsCount > 0);
    IM_ASSERT(splitter->_Current == 0);

    // Track which groups we are going to attempt to merge, and which channels goes into each group.
    struct MergeGroup
    {
        ImRect  ClipRect;
        int     ChannelsCount;
        ImBitArray<IMGUI_TABLE_MAX_DRAW_CHANNELS> ChannelsMask;
    };
    int merge_group_mask = 0x00;
    MergeGroup merge_groups[4];
    memset(merge_groups, 0, sizeof(merge_groups));

    // 1. Scan channels and take note of those which can be merged
    for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
    {
        if ((table->VisibleMaskByIndex & ((ImU64)1 << column_n)) == 0)
            continue;
        ImGuiTableColumn* column = &table->Columns[column_n];

        const int merge_group_sub_count = has_freeze_v ? 2 : 1;
        for (int merge_group_sub_n = 0; merge_group_sub_n < merge_group_sub_count; merge_group_sub_n++)
        {
            const int channel_no = (merge_group_sub_n == 0) ? column->DrawChannelFrozen : column->DrawChannelUnfrozen;

            // Don't attempt to merge if there are multiple draw calls within the column
            ImDrawChannel* src_channel = &splitter->_Channels[channel_no];
            if (src_channel->_CmdBuffer.Size > 0 && src_channel->_CmdBuffer.back().ElemCount == 0)
                src_channel->_CmdBuffer.pop_back();
            if (src_channel->_CmdBuffer.Size != 1)
                continue;

            // Find out the width of this merge group and check if it will fit in our column
            // (note that we assume that rendering didn't stray on the left direction. we should need a CursorMinPos to detect it)
            if (!(column->Flags & ImGuiTableColumnFlags_NoClip))
            {
                float content_max_x;
                if (!has_freeze_v)
                    content_max_x = ImMax(column->ContentMaxXUnfrozen, column->ContentMaxXHeadersUsed); // No row freeze
                else if (merge_group_sub_n == 0)
                    content_max_x = ImMax(column->ContentMaxXFrozen, column->ContentMaxXHeadersUsed);   // Row freeze: use width before freeze
                else
                    content_max_x = column->ContentMaxXUnfrozen;                                        // Row freeze: use width after freeze
                if (content_max_x > column->ClipRect.Max.x)
                    continue;
            }

            const int merge_group_n = (has_freeze_h && column_n < table->FreezeColumnsCount ? 0 : 1) + (has_freeze_v && merge_group_sub_n == 0 ? 0 : 2);
            IM_ASSERT(channel_no < IMGUI_TABLE_MAX_DRAW_CHANNELS);
            MergeGroup* merge_group = &merge_groups[merge_group_n];
            if (merge_group->ChannelsCount == 0)
                merge_group->ClipRect = ImRect(+FLT_MAX, +FLT_MAX, -FLT_MAX, -FLT_MAX);
            merge_group->ChannelsMask.SetBit(channel_no);
            merge_group->ChannelsCount++;
            merge_group->ClipRect.Add(src_channel->_CmdBuffer[0].ClipRect);
            merge_group_mask |= (1 << merge_group_n);
        }

        // Invalidate current draw channel
        // (we don't clear DrawChannelFrozen/DrawChannelUnfrozen solely to facilitate debugging/later inspection of data)
        column->DrawChannelCurrent = (ImGuiTableDrawChannelIdx)-1;
    }

    // [DEBUG] Display merge groups
#if 0
    if (g.IO.KeyShift)
        for (int merge_group_n = 0; merge_group_n < IM_ARRAYSIZE(merge_groups); merge_group_n++)
        {
            MergeGroup* merge_group = &merge_groups[merge_group_n];
            if (merge_group->ChannelsCount == 0)
                continue;
            char buf[32];
            ImFormatString(buf, 32, "MG%d:%d", merge_group_n, merge_group->ChannelsCount);
            ImVec2 text_pos = merge_group->ClipRect.Min + ImVec2(4, 4);
            ImVec2 text_size = CalcTextSize(buf, NULL);
            GetForegroundDrawList()->AddRectFilled(text_pos, text_pos + text_size, IM_COL32(0, 0, 0, 255));
            GetForegroundDrawList()->AddText(text_pos, IM_COL32(255, 255, 0, 255), buf, NULL);
            GetForegroundDrawList()->AddRect(merge_group->ClipRect.Min, merge_group->ClipRect.Max, IM_COL32(255, 255, 0, 255));
        }
#endif

    // 2. Rewrite channel list in our preferred order
    if (merge_group_mask != 0)
    {
        // We skip channel 0 (Bg0/Bg1) and 1 (Bg2 frozen) from the shuffling since they won't move - see channels allocation in TableSetupDrawChannels().
        const int LEADING_DRAW_CHANNELS = 2;
        g.DrawChannelsTempMergeBuffer.resize(splitter->_Count - LEADING_DRAW_CHANNELS); // Use shared temporary storage so the allocation gets amortized
        ImDrawChannel* dst_tmp = g.DrawChannelsTempMergeBuffer.Data;
        ImBitArray<IMGUI_TABLE_MAX_DRAW_CHANNELS> remaining_mask;                       // We need 132-bit of storage
        remaining_mask.ClearAllBits();
        remaining_mask.SetBitRange(LEADING_DRAW_CHANNELS, splitter->_Count);
        remaining_mask.ClearBit(table->Bg2DrawChannelUnfrozen);
        IM_ASSERT(has_freeze_v == false || table->Bg2DrawChannelUnfrozen != TABLE_DRAW_CHANNEL_BG2_FROZEN);
        int remaining_count = splitter->_Count - (has_freeze_v ? LEADING_DRAW_CHANNELS + 1 : LEADING_DRAW_CHANNELS);
        //ImRect host_rect = (table->InnerWindow == table->OuterWindow) ? table->InnerClipRect : table->HostClipRect;
        ImRect host_rect = table->HostClipRect;
        for (int merge_group_n = 0; merge_group_n < IM_ARRAYSIZE(merge_groups); merge_group_n++)
        {
            if (int merge_channels_count = merge_groups[merge_group_n].ChannelsCount)
            {
                MergeGroup* merge_group = &merge_groups[merge_group_n];
                ImRect merge_clip_rect = merge_group->ClipRect;

                // Extend outer-most clip limits to match those of host, so draw calls can be merged even if
                // outer-most columns have some outer padding offsetting them from their parent ClipRect.
                // The principal cases this is dealing with are:
                // - On a same-window table (not scrolling = single group), all fitting columns ClipRect -> will extend and match host ClipRect -> will merge
                // - Columns can use padding and have left-most ClipRect.Min.x and right-most ClipRect.Max.x != from host ClipRect -> will extend and match host ClipRect -> will merge
                // FIXME-TABLE FIXME-WORKRECT: We are wasting a merge opportunity on tables without scrolling if column doesn't fit
                // within host clip rect, solely because of the half-padding difference between window->WorkRect and window->InnerClipRect.
                if ((merge_group_n & 1) == 0 || !has_freeze_h)
                    merge_clip_rect.Min.x = ImMin(merge_clip_rect.Min.x, host_rect.Min.x);
                if ((merge_group_n & 2) == 0 || !has_freeze_v)
                    merge_clip_rect.Min.y = ImMin(merge_clip_rect.Min.y, host_rect.Min.y);
                if ((merge_group_n & 1) != 0)
                    merge_clip_rect.Max.x = ImMax(merge_clip_rect.Max.x, host_rect.Max.x);
                if ((merge_group_n & 2) != 0 && (table->Flags & ImGuiTableFlags_NoHostExtendY) == 0)
                    merge_clip_rect.Max.y = ImMax(merge_clip_rect.Max.y, host_rect.Max.y);
#if 0
                GetOverlayDrawList()->AddRect(merge_group->ClipRect.Min, merge_group->ClipRect.Max, IM_COL32(255, 0, 0, 200), 0.0f, ~0, 1.0f);
                GetOverlayDrawList()->AddLine(merge_group->ClipRect.Min, merge_clip_rect.Min, IM_COL32(255, 100, 0, 200));
                GetOverlayDrawList()->AddLine(merge_group->ClipRect.Max, merge_clip_rect.Max, IM_COL32(255, 100, 0, 200));
#endif
                remaining_count -= merge_group->ChannelsCount;
                for (int n = 0; n < IM_ARRAYSIZE(remaining_mask.Storage); n++)
                    remaining_mask.Storage[n] &= ~merge_group->ChannelsMask.Storage[n];
                for (int n = 0; n < splitter->_Count && merge_channels_count != 0; n++)
                {
                    // Copy + overwrite new clip rect
                    if (!merge_group->ChannelsMask.TestBit(n))
                        continue;
                    merge_group->ChannelsMask.ClearBit(n);
                    merge_channels_count--;

                    ImDrawChannel* channel = &splitter->_Channels[n];
                    IM_ASSERT(channel->_CmdBuffer.Size == 1 && merge_clip_rect.Contains(ImRect(channel->_CmdBuffer[0].ClipRect)));
                    channel->_CmdBuffer[0].ClipRect = merge_clip_rect.ToVec4();
                    memcpy(dst_tmp++, channel, sizeof(ImDrawChannel));
                }
            }

            // Make sure Bg2DrawChannelUnfrozen appears in the middle of our groups (whereas Bg0/Bg1 and Bg2 frozen are fixed to 0 and 1)
            if (merge_group_n == 1 && has_freeze_v)
                memcpy(dst_tmp++, &splitter->_Channels[table->Bg2DrawChannelUnfrozen], sizeof(ImDrawChannel));
        }

        // Append unmergeable channels that we didn't reorder at the end of the list
        for (int n = 0; n < splitter->_Count && remaining_count != 0; n++)
        {
            if (!remaining_mask.TestBit(n))
                continue;
            ImDrawChannel* channel = &splitter->_Channels[n];
            memcpy(dst_tmp++, channel, sizeof(ImDrawChannel));
            remaining_count--;
        }
        IM_ASSERT(dst_tmp == g.DrawChannelsTempMergeBuffer.Data + g.DrawChannelsTempMergeBuffer.Size);
        memcpy(splitter->_Channels.Data + LEADING_DRAW_CHANNELS, g.DrawChannelsTempMergeBuffer.Data, (splitter->_Count - LEADING_DRAW_CHANNELS) * sizeof(ImDrawChannel));
    }
}